

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

int32_t spvOpcodeIsComposite(Op opcode)

{
  if ((((OpTypeStruct < opcode) || ((0x71800000U >> (opcode & OpTypeOpaque) & 1) == 0)) &&
      (opcode != OpTypeCooperativeMatrixKHR)) &&
     ((opcode != OpTypeCooperativeVectorNV && (opcode != OpTypeCooperativeMatrixNV)))) {
    return 0;
  }
  return 1;
}

Assistant:

int32_t spvOpcodeIsComposite(const spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeStruct:
    case spv::Op::OpTypeRuntimeArray:
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
    case spv::Op::OpTypeCooperativeVectorNV:
      return true;
    default:
      return false;
  }
}